

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_argb.cc
# Opt level: O2

int J400ToARGB(uint8_t *src_y,int src_stride_y,uint8_t *dst_argb,int dst_stride_argb,int width,
              int height)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  int local_3c;
  code *local_38;
  
  if ((height == 0 || width < 1) || (dst_argb == (uint8_t *)0x0 || src_y == (uint8_t *)0x0)) {
    iVar1 = -1;
  }
  else {
    iVar1 = height;
    if (height < 0) {
      iVar1 = -height;
      src_y = src_y + ~height * src_stride_y;
      src_stride_y = -src_stride_y;
    }
    local_3c = dst_stride_argb;
    if (width * 4 == dst_stride_argb && src_stride_y == width) {
      width = iVar1 * width;
      iVar1 = 1;
      src_stride_y = 0;
      local_3c = 0;
    }
    iVar2 = libyuv::TestCpuFlag(0x20);
    if ((width & 7U) == 0) {
      local_38 = J400ToARGBRow_SSE2;
    }
    else {
      local_38 = J400ToARGBRow_Any_SSE2;
    }
    if (iVar2 == 0) {
      local_38 = J400ToARGBRow_C;
    }
    while (bVar3 = iVar1 != 0, iVar1 = iVar1 + -1, bVar3) {
      (*local_38)(src_y,dst_argb,width);
      src_y = src_y + src_stride_y;
      dst_argb = dst_argb + local_3c;
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

LIBYUV_API
int J400ToARGB(const uint8_t* src_y,
               int src_stride_y,
               uint8_t* dst_argb,
               int dst_stride_argb,
               int width,
               int height) {
  int y;
  void (*J400ToARGBRow)(const uint8_t* src_y, uint8_t* dst_argb, int width) =
      J400ToARGBRow_C;
  if (!src_y || !dst_argb || width <= 0 || height == 0) {
    return -1;
  }
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    src_y = src_y + (height - 1) * src_stride_y;
    src_stride_y = -src_stride_y;
  }
  // Coalesce rows.
  if (src_stride_y == width && dst_stride_argb == width * 4) {
    width *= height;
    height = 1;
    src_stride_y = dst_stride_argb = 0;
  }
#if defined(HAS_J400TOARGBROW_SSE2)
  if (TestCpuFlag(kCpuHasSSE2)) {
    J400ToARGBRow = J400ToARGBRow_Any_SSE2;
    if (IS_ALIGNED(width, 8)) {
      J400ToARGBRow = J400ToARGBRow_SSE2;
    }
  }
#endif
#if defined(HAS_J400TOARGBROW_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    J400ToARGBRow = J400ToARGBRow_Any_AVX2;
    if (IS_ALIGNED(width, 16)) {
      J400ToARGBRow = J400ToARGBRow_AVX2;
    }
  }
#endif
#if defined(HAS_J400TOARGBROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    J400ToARGBRow = J400ToARGBRow_Any_NEON;
    if (IS_ALIGNED(width, 8)) {
      J400ToARGBRow = J400ToARGBRow_NEON;
    }
  }
#endif
#if defined(HAS_J400TOARGBROW_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    J400ToARGBRow = J400ToARGBRow_Any_MMI;
    if (IS_ALIGNED(width, 4)) {
      J400ToARGBRow = J400ToARGBRow_MMI;
    }
  }
#endif
#if defined(HAS_J400TOARGBROW_MSA)
  if (TestCpuFlag(kCpuHasMSA)) {
    J400ToARGBRow = J400ToARGBRow_Any_MSA;
    if (IS_ALIGNED(width, 16)) {
      J400ToARGBRow = J400ToARGBRow_MSA;
    }
  }
#endif
  for (y = 0; y < height; ++y) {
    J400ToARGBRow(src_y, dst_argb, width);
    src_y += src_stride_y;
    dst_argb += dst_stride_argb;
  }
  return 0;
}